

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int ARGBComputeCumulativeSum
              (uint8_t *src_argb,int src_stride_argb,int32_t *dst_cumsum,int dst_stride32_cumsum,
              int width,int height)

{
  int iVar1;
  code *pcVar2;
  int32_t *piVar3;
  bool bVar4;
  
  if ((height < 1 || width < 1) || (src_argb == (uint8_t *)0x0 || dst_cumsum == (int32_t *)0x0)) {
    iVar1 = -1;
  }
  else {
    iVar1 = libyuv::TestCpuFlag(0x20);
    if (iVar1 == 0) {
      pcVar2 = ComputeCumulativeSumRow_C;
    }
    else {
      pcVar2 = ComputeCumulativeSumRow_SSE2;
    }
    memset(dst_cumsum,0,(ulong)(uint)width << 4);
    piVar3 = dst_cumsum;
    while (bVar4 = height != 0, height = height + -1, bVar4) {
      (*pcVar2)(src_argb,piVar3,dst_cumsum,width);
      src_argb = src_argb + src_stride_argb;
      dst_cumsum = piVar3;
      piVar3 = piVar3 + dst_stride32_cumsum;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int ARGBComputeCumulativeSum(const uint8_t* src_argb,
                             int src_stride_argb,
                             int32_t* dst_cumsum,
                             int dst_stride32_cumsum,
                             int width,
                             int height) {
  int y;
  void (*ComputeCumulativeSumRow)(const uint8_t* row, int32_t* cumsum,
                                  const int32_t* previous_cumsum, int width) =
      ComputeCumulativeSumRow_C;
  int32_t* previous_cumsum = dst_cumsum;
  if (!dst_cumsum || !src_argb || width <= 0 || height <= 0) {
    return -1;
  }
#if defined(HAS_CUMULATIVESUMTOAVERAGEROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    ComputeCumulativeSumRow = ComputeCumulativeSumRow_SSE2;
  }
#endif
#if defined(HAS_CUMULATIVESUMTOAVERAGEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ComputeCumulativeSumRow = ComputeCumulativeSumRow_MMI;
  }
#endif

  memset(dst_cumsum, 0, width * sizeof(dst_cumsum[0]) * 4);  // 4 int per pixel.
  for (y = 0; y < height; ++y) {
    ComputeCumulativeSumRow(src_argb, dst_cumsum, previous_cumsum, width);
    previous_cumsum = dst_cumsum;
    dst_cumsum += dst_stride32_cumsum;
    src_argb += src_stride_argb;
  }
  return 0;
}